

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMetaDataSetScalars
              (FmsMetaData mdata,char *mdata_name,FmsScalarType scal_type,FmsInt size,void **data)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  
  if (mdata == (FmsMetaData)0x0) {
    iVar1 = 1;
  }
  else if (scal_type < FMS_NUM_SCALAR_TYPES) {
    if (size == 0 || data != (void **)0x0) {
      iVar1 = FmsMetaDataClear(mdata);
      if (iVar1 == 0) {
        iVar1 = 4;
        if (size == 0) {
          __ptr = (void *)0x0;
        }
        else {
          __ptr = malloc(FmsScalarTypeSize[scal_type] * size);
          if (__ptr == (void *)0x0) {
            return 4;
          }
        }
        iVar2 = FmsCopyString(mdata_name,&mdata->name);
        if (iVar2 == 0) {
          mdata->md_type = FMS_SCALAR;
          (mdata->sub_type).scalar_type = scal_type;
          mdata->num_entries = size;
          mdata->data = __ptr;
          *data = __ptr;
          iVar1 = 0;
        }
        else {
          free(__ptr);
        }
      }
    }
    else {
      iVar1 = 3;
    }
  }
  else {
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int FmsMetaDataSetScalars(FmsMetaData mdata, const char *mdata_name,
                          FmsScalarType scal_type, FmsInt size, void **data) {
  if (!mdata) { E_RETURN(1); }
  if (scal_type >= FMS_NUM_SCALAR_TYPES) { E_RETURN(2); }
  if (size && !data) { E_RETURN(3); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  const size_t sizeof_scal_type = FmsScalarTypeSize[scal_type];
  void *md_data = size ? malloc(size*sizeof_scal_type) : NULL;
  if (size && md_data == NULL) { E_RETURN(4); }
  // On error, call free(md_data)
  // Update mdata
  if (FmsCopyString(mdata_name, &mdata->name)) { free(md_data); E_RETURN(4); }
  mdata->md_type = FMS_SCALAR;
  mdata->sub_type.scalar_type = scal_type;
  mdata->num_entries = size;
  mdata->data = md_data;
  *data = md_data;
  return 0;
}